

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O0

Node<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_> *
__thiscall
duckdb_skiplistlib::skip_list::
Node<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>::at
          (Node<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
           *this,size_t idx)

{
  size_t sVar1;
  NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
  *pNVar2;
  size_t idx_00;
  Node<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_> *in_RSI;
  Node<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_> *in_RDI;
  size_t l;
  size_t in_stack_ffffffffffffffc8;
  SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
  *in_stack_ffffffffffffffd0;
  Node<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_> *local_8;
  
  local_8 = in_RDI;
  if (in_RSI != (Node<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
                 *)0x0) {
    sVar1 = SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
            ::height((SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
                      *)0xa214ad);
    do {
      idx_00 = sVar1 - 1;
      if (sVar1 == 0) {
        return (Node<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
                *)0x0;
      }
      pNVar2 = SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
               ::operator[](in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      sVar1 = idx_00;
    } while ((pNVar2->pNode ==
              (Node<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
               *)0x0) ||
            (pNVar2 = SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
                      ::operator[](in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8),
            sVar1 = idx_00,
            in_RSI < (Node<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
                      *)pNVar2->width));
    pNVar2 = SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
             ::operator[](in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
    ::operator[]((SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
                  *)pNVar2->pNode,(size_t)in_RSI);
    local_8 = at(in_RSI,idx_00);
  }
  return local_8;
}

Assistant:

const Node<T, _Compare> *Node<T, _Compare>::at(size_t idx) const {
    assert(_nodeRefs.height());
    if (idx == 0) {
        return this;
    }
    for (size_t l = _nodeRefs.height(); l-- > 0;) {
        if (_nodeRefs[l].pNode && _nodeRefs[l].width <= idx) {
            return _nodeRefs[l].pNode->at(idx - _nodeRefs[l].width);
        }
    }
    return nullptr;
}